

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O0

Reals Omega_h::repeat_symm<3>(LO n,Tensor<3> symm)

{
  Vector<6> v_00;
  undefined4 in_register_0000003c;
  Reals RVar1;
  Reals RVar2;
  undefined1 local_1f8 [72];
  undefined8 uStack_1b0;
  Vector<6> v;
  LO n_local;
  undefined1 local_170 [24];
  undefined1 auStack_158 [24];
  undefined1 auStack_140 [28];
  undefined4 local_124;
  undefined1 *local_120;
  undefined4 local_114;
  undefined1 *local_110;
  undefined4 local_104;
  undefined1 *local_100;
  undefined4 local_f4;
  undefined1 *local_f0;
  undefined4 local_e4;
  undefined1 *local_e0;
  undefined4 local_d4;
  undefined1 *local_d0;
  undefined4 local_c4;
  undefined1 *local_c0;
  undefined4 local_b4;
  undefined1 *local_b0;
  undefined4 local_a4;
  undefined1 *local_a0;
  undefined4 local_94;
  undefined1 *local_90;
  undefined4 local_84;
  undefined1 *local_80;
  undefined4 local_74;
  undefined1 *local_70;
  undefined4 local_64;
  undefined8 *local_60;
  undefined4 local_54;
  undefined8 *local_50;
  undefined4 local_44;
  undefined8 *local_40;
  undefined4 local_34;
  undefined8 *local_30;
  undefined4 local_24;
  undefined8 *local_20;
  undefined4 local_14;
  undefined8 *local_10;
  
  RVar2.write_.shared_alloc_.alloc._4_4_ = in_register_0000003c;
  RVar2.write_.shared_alloc_.alloc._0_4_ = n;
  memcpy(local_1f8,&symm,0x48);
  memcpy(local_170,local_1f8,0x48);
  local_d0 = local_170;
  local_d4 = 0;
  local_74 = 0;
  local_10 = &uStack_1b0;
  local_14 = 0;
  local_e0 = local_170;
  local_e4 = 1;
  local_80 = auStack_158;
  local_84 = 1;
  local_20 = &uStack_1b0;
  local_24 = 1;
  local_f0 = local_170;
  local_f4 = 2;
  local_90 = auStack_140;
  local_94 = 2;
  local_30 = &uStack_1b0;
  local_34 = 2;
  local_100 = local_170;
  local_104 = 1;
  local_a0 = auStack_158;
  local_a4 = 0;
  local_40 = &uStack_1b0;
  local_44 = 3;
  local_110 = local_170;
  local_114 = 2;
  local_b0 = auStack_140;
  local_b4 = 1;
  local_50 = &uStack_1b0;
  local_54 = 4;
  local_120 = local_170;
  local_124 = 2;
  local_c0 = auStack_140;
  local_c4 = 0;
  local_60 = &uStack_1b0;
  local_64 = 5;
  v_00.super_Few<double,_6>.array_[1] = v.super_Few<double,_6>.array_[0];
  v_00.super_Few<double,_6>.array_[0] = (double)uStack_1b0;
  v_00.super_Few<double,_6>.array_[2] = v.super_Few<double,_6>.array_[1];
  v_00.super_Few<double,_6>.array_[3] = v.super_Few<double,_6>.array_[2];
  v_00.super_Few<double,_6>.array_[4] = v.super_Few<double,_6>.array_[3];
  v_00.super_Few<double,_6>.array_[5] = v.super_Few<double,_6>.array_[4];
  local_70 = local_d0;
  RVar1 = repeat_vector<6>(n,v_00);
  RVar2.write_.shared_alloc_.direct_ptr = RVar1.write_.shared_alloc_.direct_ptr;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals repeat_symm(LO const n, Tensor<dim> const symm) {
  return repeat_vector(n, symm2vector(symm));
}